

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

void __thiscall google::protobuf::io::CordInputStream::BackUp(CordInputStream *this,int count)

{
  string *psVar1;
  unsigned_long uVar2;
  unsigned_long local_28 [2];
  unsigned_long local_18;
  
  uVar2 = (unsigned_long)count;
  local_18 = this->size_ - this->available_;
  local_28[0] = uVar2;
  psVar1 = absl::lts_20240722::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                     (local_28,&local_18,"static_cast<size_t>(count) <= size_ - available_");
  if (psVar1 == (string *)0x0) {
    this->available_ = this->available_ + uVar2;
    this->bytes_remaining_ = this->bytes_remaining_ + uVar2;
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
             ,0x201,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

void CordInputStream::BackUp(int count) {
  // Backup is only allowed on last returned chunk from `Next()`.
  ABSL_CHECK_LE(static_cast<size_t>(count), size_ - available_);

  available_ += count;
  bytes_remaining_ += count;
}